

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void getCellInfo(BtCursor *pCur)

{
  int iPage;
  BtCursor *pCur_local;
  
  if ((pCur->info).nSize == 0) {
    pCur->curFlags = pCur->curFlags | 2;
    btreeParseCell(pCur->apPage[(int)pCur->iPage],(uint)pCur->ix,&pCur->info);
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void getCellInfo(BtCursor *pCur){
  if( pCur->info.nSize==0 ){
    int iPage = pCur->iPage;
    pCur->curFlags |= BTCF_ValidNKey;
    btreeParseCell(pCur->apPage[iPage],pCur->ix,&pCur->info);
  }else{
    assertCellInfo(pCur);
  }
}